

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
* __thiscall
google::protobuf::internal::TailCallTableInfo::BuildFieldEntries
          (vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
           *__return_storage_ptr__,TailCallTableInfo *this,Descriptor *descriptor,
          MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields,
          vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          *aux_entries)

{
  uint32_t uVar1;
  bool bVar2;
  Utf8CheckMode UVar3;
  uint16_t uVar4;
  Type TVar5;
  size_type sVar6;
  Descriptor *pDVar7;
  FieldOptions *this_00;
  reference pvVar8;
  EnumDescriptor *enum_type;
  LogMessage *pLVar9;
  char *failure_msg;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *this_01;
  AuxType local_240;
  LogMessage local_1e0;
  Voidify local_1c9;
  unsigned_long local_1c8;
  unsigned_long local_1c0;
  Nullable<const_char_*> local_1b8;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  anon_union_8_4_4b2d21c6_for_AuxEntry_1 local_1a8;
  uint32_t local_1a0;
  byte local_199;
  int idx;
  Voidify local_181;
  reference local_180;
  value_type *aux_entry;
  anon_union_8_4_4b2d21c6_for_AuxEntry_1 local_170;
  value_type local_168;
  AuxType local_158;
  undefined4 uStack_154;
  FieldDescriptor *local_150;
  AuxType local_144;
  undefined1 local_140 [4];
  AuxType type;
  anon_union_8_4_4b2d21c6_for_AuxEntry_1 local_138;
  value_type local_130;
  value_type local_120;
  value_type local_110;
  value_type local_100;
  FieldDescriptor *local_f0;
  FieldDescriptor *map_value;
  anon_union_8_4_4b2d21c6_for_AuxEntry_1 local_e0;
  reference local_d8;
  value_type *entry;
  int local_c8;
  int local_c4;
  uint16_t local_c0;
  uint16_t local_be;
  Utf8CheckMode local_bc;
  FieldDescriptor *local_b8;
  FieldDescriptor *field;
  FieldOptions *options_1;
  iterator __end2_1;
  iterator __begin2_1;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *__range2_1;
  size_t subtable_aux_idx;
  size_t subtable_aux_idx_begin;
  FieldOptions *options;
  iterator __end2;
  iterator __begin2;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *__range2;
  anon_class_8_1_3974b2eb is_non_cold_subtable;
  size_t num_non_cold_subtables;
  anon_class_1_0_00000001 is_non_cold;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *aux_entries_local;
  MessageOptions *message_options_local;
  Descriptor *descriptor_local;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_local;
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  *field_entries;
  
  this_01 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
             *)ordered_fields.len_;
  ordered_fields_local.ptr_ = ordered_fields.ptr_;
  descriptor_local = (Descriptor *)message_options;
  ordered_fields_local.len_ = (size_type)__return_storage_ptr__;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ::vector(__return_storage_ptr__);
  sVar6 = absl::lts_20250127::
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::size
                    ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                     &descriptor_local);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ::reserve(__return_storage_ptr__,sVar6);
  is_non_cold_subtable.is_non_cold = (anon_class_1_0_00000001 *)0x0;
  __range2 = (Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
             ((long)&num_non_cold_subtables + 3);
  __begin2 = (iterator)&descriptor_local;
  __end2 = absl::lts_20250127::
           Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::begin
                     ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                      __begin2);
  options = absl::lts_20250127::
            Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::end
                      ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                       __begin2);
  for (; __end2 != options; __end2 = __end2 + 1) {
    subtable_aux_idx_begin = (size_t)__end2;
    bVar2 = BuildFieldEntries::anon_class_8_1_3974b2eb::operator()
                      ((anon_class_8_1_3974b2eb *)&__range2,__end2);
    if (bVar2) {
      is_non_cold_subtable.is_non_cold = is_non_cold_subtable.is_non_cold + 1;
    }
  }
  subtable_aux_idx =
       std::
       vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
       ::size(this_01);
  __range2_1 = (Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
               std::
               vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               ::size(this_01);
  sVar6 = std::
          vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          ::size(this_01);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ::resize(this_01,(size_type)(is_non_cold_subtable.is_non_cold + sVar6));
  __begin2_1 = (iterator)&descriptor_local;
  __end2_1 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::begin
                       ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                        __begin2_1);
  options_1 = absl::lts_20250127::
              Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::end
                        ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                         __begin2_1);
  do {
    if (__end2_1 == options_1) {
      local_1c0 = absl::lts_20250127::log_internal::GetReferenceableValue
                            ((long)__range2_1 - subtable_aux_idx);
      local_1c8 = absl::lts_20250127::log_internal::GetReferenceableValue
                            ((unsigned_long)is_non_cold_subtable.is_non_cold);
      local_1b8 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                            (&local_1c0,&local_1c8,
                             "subtable_aux_idx - subtable_aux_idx_begin == num_non_cold_subtables");
      if (local_1b8 != (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_1b8);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x38e,failure_msg);
        pLVar9 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1e0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1c9,pLVar9);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_1e0);
      }
      return __return_storage_ptr__;
    }
    field = (FieldDescriptor *)__end2_1;
    entry = (value_type *)__end2_1->field;
    local_c8 = __end2_1->has_bit_index;
    local_c4 = 0;
    local_c0 = 0;
    local_be = 0;
    local_bc = kStrict;
    local_b8 = (FieldDescriptor *)entry;
    std::
    vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
    ::push_back(__return_storage_ptr__,(value_type *)&entry);
    local_d8 = std::
               vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
               ::back(__return_storage_ptr__);
    UVar3 = cpp::GetUtf8CheckMode(local_b8,(bool)((descriptor->super_SymbolBase).symbol_type_ & 1));
    local_d8->utf8_check_mode = UVar3;
    uVar4 = anon_unknown_36::MakeTypeCardForField
                      (local_b8,(bool)((byte)~(byte)((uint)local_d8->hasbit_idx >> 0x18) >> 7),
                       (FieldOptions *)field,local_d8->utf8_check_mode);
    local_d8->type_card = uVar4;
    TVar5 = FieldDescriptor::type(local_b8);
    if ((TVar5 == TYPE_MESSAGE) || (TVar5 = FieldDescriptor::type(local_b8), TVar5 == TYPE_GROUP)) {
      bVar2 = FieldDescriptor::is_map(local_b8);
      if (bVar2) {
        sVar6 = std::
                vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                ::size(this_01);
        local_d8->aux_idx = (uint16_t)sVar6;
        map_value._0_4_ = 0xc;
        local_e0.field = local_b8;
        std::
        vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        ::push_back(this_01,(value_type *)&map_value);
        if ((descriptor->field_0x1 & 1) != 0) {
          pDVar7 = FieldDescriptor::message_type(local_b8);
          local_f0 = Descriptor::map_value(pDVar7);
          pDVar7 = FieldDescriptor::message_type(local_f0);
          if (pDVar7 == (Descriptor *)0x0) {
            TVar5 = FieldDescriptor::type(local_f0);
            if ((TVar5 == TYPE_ENUM) &&
               (bVar2 = cpp::HasPreservingUnknownEnumSemantics(local_f0), !bVar2)) {
              local_110.type = kEnumValidator;
              local_110.field_1.field = local_f0;
              std::
              vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              ::push_back(this_01,&local_110);
            }
          }
          else {
            local_100.type = kSubTable;
            local_100.field_1.field = local_f0;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::push_back(this_01,&local_100);
          }
        }
      }
      else {
        this_00 = FieldDescriptor::options(local_b8);
        bVar2 = FieldOptions::weak(this_00);
        if (bVar2) {
          local_d8->type_card = 0;
        }
        else {
          bVar2 = anon_unknown_36::HasLazyRep(local_b8,(FieldOptions *)field);
          if (bVar2) {
            if ((descriptor->field_0x1 & 1) == 0) {
              local_d8->aux_idx = 0xffff;
            }
            else {
              sVar6 = std::
                      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                      ::size(this_01);
              local_d8->aux_idx = (uint16_t)sVar6;
              local_120.type = kSubMessage;
              local_120.field_1.field = local_b8;
              std::
              vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              ::push_back(this_01,&local_120);
              if (*(short *)&field->file_ == 0x200) {
                local_130.type = kMessageVerifyFunc;
                local_130.field_1.field = local_b8;
                std::
                vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                ::push_back(this_01,&local_130);
              }
              else {
                local_140 = (undefined1  [4])0x0;
                local_138.field = (FieldDescriptor *)0x0;
                std::
                vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                ::push_back(this_01,(value_type *)local_140);
              }
            }
          }
          else {
            if (((ulong)field->file_ & 0x1000000) == 0) {
              local_240 = kSubMessage;
              if (((ulong)field->file_ & 0x100000000) != 0) {
                local_240 = kSubTable;
              }
            }
            else {
              local_240 = kSubMessageWeak;
            }
            local_144 = local_240;
            if ((local_240 == kSubTable) &&
               (bVar2 = BuildFieldEntries::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)((long)&num_non_cold_subtables + 3),
                                   (FieldOptions *)field), bVar2)) {
              local_158 = local_144;
              local_150 = local_b8;
              pvVar8 = std::
                       vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                       ::operator[](this_01,(size_type)__range2_1);
              *(ulong *)pvVar8 = CONCAT44(uStack_154,local_158);
              (pvVar8->field_1).field = local_150;
              local_d8->aux_idx = (uint16_t)__range2_1;
              __range2_1 = (Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>
                            *)((long)&__range2_1->ptr_ + 1);
            }
            else {
              sVar6 = std::
                      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                      ::size(this_01);
              local_d8->aux_idx = (uint16_t)sVar6;
              local_168.type = local_144;
              local_168.field_1.field = local_b8;
              std::
              vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              ::push_back(this_01,&local_168);
            }
          }
        }
      }
    }
    else {
      TVar5 = FieldDescriptor::type(local_b8);
      if ((TVar5 != TYPE_ENUM) || (bVar2 = anon_unknown_36::TreatEnumAsInt(local_b8), bVar2)) {
        TVar5 = FieldDescriptor::type(local_b8);
        if (((TVar5 == TYPE_STRING) ||
            (TVar5 = FieldDescriptor::type(local_b8), TVar5 == TYPE_BYTES)) &&
           (((ulong)field->file_ & 0x10000) != 0)) {
          local_199 = 0;
          bVar2 = FieldDescriptor::is_repeated(local_b8);
          if (bVar2) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&idx,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                       ,0x380,"!field->is_repeated()");
            local_199 = 1;
            pLVar9 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                               ((LogMessage *)&idx);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_181,pLVar9);
          }
          if ((local_199 & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&idx);
          }
          local_1a0 = *(uint32_t *)&field->type_once_;
          sVar6 = std::
                  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  ::size(this_01);
          local_d8->aux_idx = (uint16_t)sVar6;
          absl_log_internal_check_op_result._0_4_ = 0xb;
          local_1a8.field = (FieldDescriptor *)0x0;
          std::
          vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          ::push_back(this_01,(value_type *)&absl_log_internal_check_op_result);
          uVar1 = local_1a0;
          pvVar8 = std::
                   vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                   ::back(this_01);
          (pvVar8->field_1).offset = uVar1;
          local_d8->inlined_string_idx = local_1a0;
        }
      }
      else {
        sVar6 = std::
                vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                ::size(this_01);
        local_d8->aux_idx = (uint16_t)sVar6;
        aux_entry._0_4_ = 0;
        local_170.field = (FieldDescriptor *)0x0;
        std::
        vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        ::push_back(this_01,(value_type *)&aux_entry);
        local_180 = std::
                    vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                    ::back(this_01);
        enum_type = FieldDescriptor::enum_type(local_b8);
        bVar2 = anon_unknown_36::GetEnumValidationRange
                          (enum_type,(int32_t *)&(local_180->field_1).offset,
                           &(local_180->field_1).enum_range.last);
        if (bVar2) {
          local_180->type = kEnumRange;
        }
        else {
          local_180->type = kEnumValidator;
          (local_180->field_1).field = local_b8;
        }
      }
    }
    __end2_1 = __end2_1 + 1;
  } while( true );
}

Assistant:

std::vector<TailCallTableInfo::FieldEntryInfo>
TailCallTableInfo::BuildFieldEntries(
    const Descriptor* descriptor, const MessageOptions& message_options,
    absl::Span<const FieldOptions> ordered_fields,
    std::vector<TailCallTableInfo::AuxEntry>& aux_entries) {
  std::vector<FieldEntryInfo> field_entries;
  field_entries.reserve(ordered_fields.size());

  const auto is_non_cold = [](const FieldOptions& options) {
    return options.presence_probability >= 0.005;
  };
  size_t num_non_cold_subtables = 0;
  // We found that clustering non-cold subtables to the top of aux_entries
  // achieves the best load tests results than other strategies (e.g.,
  // clustering all non-cold entries).
  const auto is_non_cold_subtable = [&](const FieldOptions& options) {
    auto* field = options.field;
    // In the following code where we assign kSubTable to aux entries, only
    // the following typed fields are supported.
    return (field->type() == FieldDescriptor::TYPE_MESSAGE ||
            field->type() == FieldDescriptor::TYPE_GROUP) &&
           !field->is_map() && !field->options().weak() &&
           !HasLazyRep(field, options) && !options.is_implicitly_weak &&
           options.use_direct_tcparser_table && is_non_cold(options);
  };
  for (const FieldOptions& options : ordered_fields) {
    if (is_non_cold_subtable(options)) {
      num_non_cold_subtables++;
    }
  }

  size_t subtable_aux_idx_begin = aux_entries.size();
  size_t subtable_aux_idx = aux_entries.size();
  aux_entries.resize(aux_entries.size() + num_non_cold_subtables);

  // Fill in mini table entries.
  for (const auto& options : ordered_fields) {
    auto* field = options.field;
    field_entries.push_back({field, options.has_bit_index});
    auto& entry = field_entries.back();
    entry.utf8_check_mode =
        cpp::GetUtf8CheckMode(field, message_options.is_lite);
    entry.type_card = MakeTypeCardForField(field, entry.hasbit_idx >= 0,
                                           options, entry.utf8_check_mode);

    if (field->type() == FieldDescriptor::TYPE_MESSAGE ||
        field->type() == FieldDescriptor::TYPE_GROUP) {
      // Message-typed fields have a FieldAux with the default instance pointer.
      if (field->is_map()) {
        entry.aux_idx = aux_entries.size();
        aux_entries.push_back({kMapAuxInfo, {field}});
        if (message_options.uses_codegen) {
          // If we don't use codegen we can't add these.
          auto* map_value = field->message_type()->map_value();
          if (map_value->message_type() != nullptr) {
            aux_entries.push_back({kSubTable, {map_value}});
          } else if (map_value->type() == FieldDescriptor::TYPE_ENUM &&
                     !cpp::HasPreservingUnknownEnumSemantics(map_value)) {
            aux_entries.push_back({kEnumValidator, {map_value}});
          }
        }
      } else if (field->options().weak()) {
        // Disable the type card for this entry to force the fallback.
        entry.type_card = 0;
      } else if (HasLazyRep(field, options)) {
        if (message_options.uses_codegen) {
          entry.aux_idx = aux_entries.size();
          aux_entries.push_back({kSubMessage, {field}});
          if (options.lazy_opt == field_layout::kTvEager) {
            aux_entries.push_back({kMessageVerifyFunc, {field}});
          } else {
            aux_entries.push_back({kNothing});
          }
        } else {
          entry.aux_idx = TcParseTableBase::FieldEntry::kNoAuxIdx;
        }
      } else {
        AuxType type = options.is_implicitly_weak          ? kSubMessageWeak
                       : options.use_direct_tcparser_table ? kSubTable
                                                           : kSubMessage;
        if (type == kSubTable && is_non_cold(options)) {
          aux_entries[subtable_aux_idx] = {type, {field}};
          entry.aux_idx = subtable_aux_idx;
          ++subtable_aux_idx;
        } else {
          entry.aux_idx = aux_entries.size();
          aux_entries.push_back({type, {field}});
        }
      }
    } else if (field->type() == FieldDescriptor::TYPE_ENUM &&
               !TreatEnumAsInt(field)) {
      // Enum fields which preserve unknown values (proto3 behavior) are
      // effectively int32 fields with respect to parsing -- i.e., the value
      // does not need to be validated at parse time.
      //
      // Enum fields which do not preserve unknown values (proto2 behavior) use
      // a FieldAux to store validation information. If the enum values are
      // sequential (and within a range we can represent), then the FieldAux
      // entry represents the range using the minimum value (which must fit in
      // an int16_t) and count (a uint16_t). Otherwise, the entry holds a
      // pointer to the generated Name_IsValid function.

      entry.aux_idx = aux_entries.size();
      aux_entries.push_back({});
      auto& aux_entry = aux_entries.back();

      if (GetEnumValidationRange(field->enum_type(), aux_entry.enum_range.first,
                                 aux_entry.enum_range.last)) {
        aux_entry.type = kEnumRange;
      } else {
        aux_entry.type = kEnumValidator;
        aux_entry.field = field;
      }

    } else if ((field->type() == FieldDescriptor::TYPE_STRING ||
                field->type() == FieldDescriptor::TYPE_BYTES) &&
               options.is_string_inlined) {
      ABSL_CHECK(!field->is_repeated());
      // Inlined strings have an extra marker to represent their donation state.
      int idx = options.inlined_string_index;
      // For mini parsing, the donation state index is stored as an `offset`
      // auxiliary entry.
      entry.aux_idx = aux_entries.size();
      aux_entries.push_back({kNumericOffset});
      aux_entries.back().offset = idx;
      // For fast table parsing, the donation state index is stored instead of
      // the aux_idx (this will limit the range to 8 bits).
      entry.inlined_string_idx = idx;
    }
  }
  ABSL_CHECK_EQ(subtable_aux_idx - subtable_aux_idx_begin,
                num_non_cold_subtables);

  return field_entries;
}